

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent::~IfcTextLiteralWithExtent
          (IfcTextLiteralWithExtent *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar2;
  
  this[-1].super_IfcTextLiteral.Placement.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x8d98b8;
  *(undefined8 *)&(this->super_IfcTextLiteral).field_0x38 = 0x8d9958;
  this[-1].super_IfcTextLiteral.Path._M_dataplus._M_p = (pointer)0x8d98e0;
  this[-1].super_IfcTextLiteral.Path.field_2._M_allocated_capacity = 0x8d9908;
  (this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8d9930;
  puVar2 = *(undefined1 **)
            &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
  puVar1 = &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.field_0x28;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  this[-1].super_IfcTextLiteral.Placement.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x8d9a30;
  *(undefined8 *)&(this->super_IfcTextLiteral).field_0x38 = 0x8d9aa8;
  this[-1].super_IfcTextLiteral.Path._M_dataplus._M_p = (pointer)0x8d9a58;
  this[-1].super_IfcTextLiteral.Path.field_2._M_allocated_capacity = 0x8d9a80;
  puVar1 = *(undefined1 **)((long)&this[-1].BoxAlignment.field_2 + 8);
  if (puVar1 != &this[-1].field_0xc0) {
    operator_delete(puVar1,*(long *)&this[-1].field_0xc0 + 1);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            this[-1].BoxAlignment.field_2._M_allocated_capacity;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcTextLiteral.field_0x80;
  puVar2 = &this[-1].super_IfcTextLiteral.field_0x90;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcTextLiteral.Placement,0xd0);
  return;
}

Assistant:

IfcTextLiteralWithExtent() : Object("IfcTextLiteralWithExtent") {}